

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O1

bool __thiscall
GLRParser::checkProductionRules
          (GLRParser *this,
          vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
          *possibleParseStacks,
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *stack,stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
                 *productions,GLRState *currentState,
          set<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
          *alreadyReducedStacks,bool final)

{
  Production *this_00;
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  size_t __n;
  long lVar4;
  pointer pcVar5;
  int *piVar6;
  int iVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  iterator iVar10;
  _Map_pointer ppbVar11;
  string *psVar12;
  _Base_ptr p_Var13;
  GLRState *currentState_00;
  _Base_ptr p_Var14;
  _Elt_pointer pbVar15;
  _Rb_tree_header *p_Var16;
  byte bVar17;
  int i;
  ulong uVar18;
  bool bVar19;
  string stateName;
  string newVariable;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newStack;
  set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
  parseOperations;
  set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
  parseOperationsb;
  stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> newProductions;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newNewStack;
  value_type local_240;
  value_type local_220;
  pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>
  local_200;
  _Base_ptr local_1a8;
  _Rb_tree_node_base *local_1a0;
  stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *local_198;
  vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>
  *local_190;
  _Rb_tree<ParseOperation_*,_ParseOperation_*,_std::_Identity<ParseOperation_*>,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
  local_188;
  _Rb_tree<ParseOperation_*,_ParseOperation_*,_std::_Identity<ParseOperation_*>,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
  local_158;
  _Deque_base<Production_*,_std::allocator<Production_*>_> local_128;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  key_type local_88;
  
  if (currentState->accepting == true) {
    local_188._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_188._M_impl.super__Rb_tree_header._M_header;
    local_188._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_188._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_188._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var13 = (currentState->productions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var16 = &(currentState->productions)._M_t._M_impl.super__Rb_tree_header;
    local_198 = productions;
    local_190 = (vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>
                 *)possibleParseStacks;
    local_188._M_impl.super__Rb_tree_header._M_header._M_right =
         local_188._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var13 != p_Var16) {
      local_1a8 = &(alreadyReducedStacks->_M_t)._M_impl.super__Rb_tree_header._M_header;
      local_1a0 = &p_Var16->_M_header;
      do {
        this_00 = *(Production **)(p_Var13 + 1);
        pvVar8 = Production::getToP_abi_cxx11_(this_00);
        pvVar9 = Production::getToP_abi_cxx11_(this_00);
        pbVar1 = (pvVar9->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pbVar2 = (pvVar9->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (pvVar8->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        getMarker_abi_cxx11_();
        __n = *(size_t *)((long)pbVar1 + (long)pbVar3 + (-0x18 - (long)pbVar2));
        if (__n == local_200.first.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size) {
          if (__n == 0) {
            bVar19 = true;
          }
          else {
            iVar7 = bcmp(*(void **)((long)pbVar1 + (long)pbVar3 + (-0x20 - (long)pbVar2)),
                         local_200.first.c.
                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_map,__n);
            bVar19 = iVar7 == 0;
          }
        }
        else {
          bVar19 = false;
        }
        if (bVar19) {
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88,&stack->c);
          local_88.second = this_00;
          iVar10 = std::
                   _Rb_tree<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::_Identity<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
                   ::find(&alreadyReducedStacks->_M_t,&local_88);
          bVar19 = iVar10._M_node == local_1a8;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_88);
        }
        else {
          bVar19 = false;
        }
        if ((iterator *)
            local_200.first.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map !=
            (iterator *)
            ((long)&local_200.first.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data + 0x10U)) {
          operator_delete(local_200.first.c.
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_map,
                          (ulong)((long)&((local_200.first.c.
                                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                         _M_dataplus)._M_p + 1));
        }
        if (bVar19) {
          ppbVar11 = (_Map_pointer)operator_new(0x18);
          ppbVar11[1] = &this_00->fromP;
          ppbVar11[2] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          psVar12 = Production::getFromP_abi_cxx11_(this_00);
          iVar7 = std::__cxx11::string::compare((char *)psVar12);
          *(uint *)ppbVar11 = (iVar7 == 0) + 2;
          local_200.first.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map = ppbVar11;
          std::
          _Rb_tree<ParseOperation*,ParseOperation*,std::_Identity<ParseOperation*>,std::less<ParseOperation*>,std::allocator<ParseOperation*>>
          ::_M_insert_unique<ParseOperation*>
                    ((_Rb_tree<ParseOperation*,ParseOperation*,std::_Identity<ParseOperation*>,std::less<ParseOperation*>,std::allocator<ParseOperation*>>
                      *)&local_188,(ParseOperation **)&local_200);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_200,&stack->c);
          local_200.second = this_00;
          std::
          _Rb_tree<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>,std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>,std::_Identity<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>,std::less<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>>
          ::
          _M_insert_unique<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>
                    ((_Rb_tree<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>,std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>,std::_Identity<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>,std::less<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>>
                      *)alreadyReducedStacks,&local_200);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_200);
        }
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      } while (p_Var13 != local_1a0);
    }
    bVar17 = 0;
    if ((_Rb_tree_header *)local_188._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_188._M_impl.super__Rb_tree_header) {
      p_Var13 = local_188._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        lVar4 = *(long *)(p_Var13 + 1);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_200,&stack->c);
        std::deque<Production_*,_std::allocator<Production_*>_>::deque
                  ((deque<Production_*,_std::allocator<Production_*>_> *)&local_128,&local_198->c);
        for (uVar18 = 0; pvVar8 = Production::getToP_abi_cxx11_(*(Production **)(lVar4 + 8)),
            uVar18 < ((long)(pvVar8->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar8->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U;
            uVar18 = uVar18 + 1) {
          if (local_200.first.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              local_200.first.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_200);
          }
          if (local_200.first.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              local_200.first.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_200);
          }
        }
        if (local_200.first.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_200.first.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          psVar12 = Production::getFromP_abi_cxx11_(*(Production **)(lVar4 + 8));
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          pcVar5 = (psVar12->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_220,pcVar5,pcVar5 + psVar12->_M_string_length);
          pbVar15 = local_200.first.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_200.first.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_200.first.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pbVar15 = local_200.first.c.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
          }
          currentState_00 = findState(this,pbVar15 + -1);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_200,&local_220);
          local_d8.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map = *(_Map_pointer *)(lVar4 + 8);
          std::deque<Production*,std::allocator<Production*>>::emplace_back<Production*>
                    ((deque<Production*,std::allocator<Production*>> *)&local_128,
                     (Production **)&local_d8);
          findParseOptions((set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
                            *)&local_158,this,&local_220,currentState_00);
          for (p_Var14 = local_158._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var14 != &local_158._M_impl.super__Rb_tree_header;
              p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
            piVar6 = *(int **)(p_Var14 + 1);
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::deque(&local_d8.c,
                    (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_200);
            local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
            local_240._M_string_length = 0;
            local_240.field_2._M_local_buf[0] = '\0';
            if (*piVar6 == 3) {
              std::__cxx11::string::_M_replace((ulong)&local_240,0,(char *)0x0,0x12f552);
              bVar17 = final;
            }
            else {
              std::__cxx11::string::_M_assign((string *)&local_240);
            }
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_d8.c,&local_240);
            std::
            vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>
            ::
            emplace_back<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>&>
                      (local_190,&local_d8,
                       (stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
                        *)&local_128);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p,
                              CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                                       local_240.field_2._M_local_buf[0]) + 1);
            }
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~deque(&local_d8.c);
          }
          std::
          _Rb_tree<ParseOperation_*,_ParseOperation_*,_std::_Identity<ParseOperation_*>,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
          ::~_Rb_tree(&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
        }
        std::_Deque_base<Production_*,_std::allocator<Production_*>_>::~_Deque_base(&local_128);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_200);
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      } while ((_Rb_tree_header *)p_Var13 != &local_188._M_impl.super__Rb_tree_header);
    }
    std::
    _Rb_tree<ParseOperation_*,_ParseOperation_*,_std::_Identity<ParseOperation_*>,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
    ::~_Rb_tree(&local_188);
  }
  else {
    bVar17 = 0;
  }
  return (bool)(bVar17 & 1);
}

Assistant:

bool
GLRParser::checkProductionRules(
        vector<pair<std::stack<std::string>, std::stack<Production *>>> &possibleParseStacks,
        const std::stack<std::string> &stack,
        const std::stack<Production *> &productions,
        const GLRState *currentState,
        set<pair<std::stack<std::string>, Production *>> &alreadyReducedStacks,
        bool final) {// Check for possible reduces

    bool finalStack = false;
    if (currentState->isAccepting()) {
        // TODO: push production on stack
        set<ParseOperation *> parseOperations;

        // Find the possible reduces
        for (auto prod: currentState->getProductions()) {
            if (prod->getToP()[prod->getToP().size() - 1] == getMarker() &&
                alreadyReducedStacks.find(std::pair<std::stack<std::string>, Production *>(stack, prod)) ==
                alreadyReducedStacks.end()) {
                parseOperations.insert(new ParseOperation(prod));
                alreadyReducedStacks.insert(std::pair<std::stack<std::string>, Production *>(stack, prod));
            }
        }

        for (ParseOperation *parseOperation: parseOperations) {
            std::stack<std::string> newStack = stack;
            std::stack<Production *> newProductions = productions;

            // Pop the left side of the production from the stack
            for (int i = 0; i < parseOperation->getReduceProduction()->getToP().size() - 1; ++i) {
                // pop all elements from the stack (exclude the marker)
                if(!newStack.empty())
                    newStack.pop(); // pop the state marker
                if(!newStack.empty())
                    newStack.pop(); // pop the string element
            }

            if(newStack.empty())
                continue;

            // Push the right side and determine the new top state
            string newVariable = parseOperation->getReduceProduction()->getFromP();
            GLRState *currentTopState = findState(newStack.top());
            newStack.push(newVariable);
            newProductions.push(parseOperation->getReduceProduction());

            set<ParseOperation *> parseOperationsb = findParseOptions(newVariable, currentTopState);

            for (auto stackOp: parseOperationsb) {

                // For every new possible stack, create a new state
                std::stack<string> newNewStack = newStack;
                std::string stateName;
                if (stackOp->getOperationType() == ParseOperation::accept) {
//                    if (!final) {
//                        continue;
//                    }
//                    std::stack<std::string> acceptStack;
//                    acceptStack.push("accept");
//                    possibleParseStacks.emplace_back(acceptStack,
//                                                     newProductions);
                    finalStack = final;
                    stateName = "accept";
                } else {
                    stateName = stackOp->getNewState()->getName();
                }
                newNewStack.push(stateName);
                // Add this to the possibleParseStacks, so it can still be evaluated this round. (because this stack hasn't yet consumed char c)
                possibleParseStacks.emplace_back(newNewStack,
                                                 newProductions); // i (on which we're iterating) mustn't decrease, because we're checking the size & inserting at the end

//                cout << "Reduced, new stack: ";
//                printStack(newNewStack);
//                cout << endl;
            }
        }
    }


    return finalStack;
}